

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestCase *
vkt::pipeline::anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::ComputeCacheTest>
          (TestContext *testContext,CacheTestParam *testParam)

{
  CacheTestParam *testContext_00;
  ComputeCacheTest *this;
  char *pcVar1;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88;
  allocator<char> local_65 [13];
  string local_58 [32];
  string local_38;
  CacheTestParam *local_18;
  CacheTestParam *testParam_local;
  TestContext *testContext_local;
  
  local_18 = testParam;
  testParam_local = (CacheTestParam *)testContext;
  this = (ComputeCacheTest *)operator_new(0x98);
  testContext_00 = testParam_local;
  (*local_18->_vptr_CacheTestParam[2])(local_58);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,local_65);
  (*local_18->_vptr_CacheTestParam[3])(local_a8);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_a9);
  ComputeCacheTest::ComputeCacheTest
            (this,(TestContext *)testContext_00,&local_38,&local_88,local_18);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(local_65);
  std::__cxx11::string::~string(local_58);
  return (TestCase *)this;
}

Assistant:

vkt::TestCase* newTestCase (tcu::TestContext&     testContext,
							const CacheTestParam* testParam)
{
	return new Test(testContext,
					testParam->generateTestName().c_str(),
					testParam->generateTestDescription().c_str(),
					testParam);
}